

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws_handshake.c
# Opt level: O0

void nn_ws_handshake_server_reply(nn_ws_handshake *self)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  ulong uVar4;
  size_t in_RDI;
  char *unaff_retaddr;
  size_t in_stack_00000008;
  char accept_key [29];
  int rc;
  char *protocol;
  char *version;
  char *code;
  nn_iovec response;
  undefined8 in_stack_ffffffffffffffa0;
  int iovcnt;
  nn_iovec *in_stack_ffffffffffffffa8;
  nn_usock *in_stack_ffffffffffffffb0;
  char *local_20;
  
  iovcnt = (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  memset((void *)(in_RDI + 0x128c),0,0x200);
  if (*(int *)(in_RDI + 0x1288) == 0) {
    iVar1 = nn_ws_handshake_hash_key
                      ((char *)accept_key._0_8_,in_stack_00000008,unaff_retaddr,in_RDI);
    if (iVar1 < 0) {
      nn_backtrace_print();
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc >= 0",
              "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/ws/ws_handshake.c"
              ,0x512);
      fflush(_stderr);
      nn_err_abort();
    }
    sVar2 = strlen(&stack0xffffffffffffffa8);
    if (sVar2 != 0x1c) {
      nn_backtrace_print();
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
              "strlen (accept_key) == NN_WS_HANDSHAKE_ACCEPT_KEY_LEN",
              "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/ws/ws_handshake.c"
              ,0x514);
      fflush(_stderr);
      nn_err_abort();
    }
    pcVar3 = (char *)nn_alloc_(0x14caea);
    if (pcVar3 == (char *)0x0) {
      nn_backtrace_print();
      fprintf(_stderr,"Out of memory (%s:%d)\n",
              "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/ws/ws_handshake.c"
              ,0x517);
      fflush(_stderr);
      nn_err_abort();
    }
    strncpy(pcVar3,*(char **)(in_RDI + 0x11f8),*(size_t *)(in_RDI + 0x1200));
    pcVar3[*(long *)(in_RDI + 0x1200)] = '\0';
    sprintf((char *)(in_RDI + 0x128c),
            "HTTP/1.1 101 Switching Protocols\r\nUpgrade: websocket\r\nConnection: Upgrade\r\nSec-WebSocket-Accept: %s\r\nSec-WebSocket-Protocol: %s\r\n\r\n"
            ,&stack0xffffffffffffffa8,pcVar3);
    nn_free((void *)0x14cbab);
  }
  else {
    uVar4 = (ulong)(*(int *)(in_RDI + 0x1288) - 1);
    switch(uVar4) {
    case 0:
      local_20 = "400 Opening Handshake Too Long";
      break;
    default:
      nn_backtrace_print();
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","0",
              "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/ws/ws_handshake.c"
              ,0x53c);
      fflush(_stderr);
      nn_err_abort();
    case 2:
      local_20 = "400 Cannot Have Body";
      break;
    case 3:
      local_20 = "400 Unsupported WebSocket Version";
      break;
    case 4:
      local_20 = "400 Missing nanomsg Required Headers";
      break;
    case 5:
      local_20 = "400 Incompatible Socket Type";
      break;
    case 6:
      local_20 = "400 Unrecognized Socket Type";
    }
    pcVar3 = (char *)nn_alloc_(0x14cc91);
    iovcnt = (int)(uVar4 >> 0x20);
    if (pcVar3 == (char *)0x0) {
      nn_backtrace_print();
      fprintf(_stderr,"Out of memory (%s:%d)\n",
              "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/ws/ws_handshake.c"
              ,0x541);
      fflush(_stderr);
      nn_err_abort();
    }
    strncpy(pcVar3,*(char **)(in_RDI + 0x11e8),*(size_t *)(in_RDI + 0x11f0));
    pcVar3[*(long *)(in_RDI + 0x11f0)] = '\0';
    sprintf((char *)(in_RDI + 0x128c),"HTTP/1.1 %s\r\nSec-WebSocket-Version: %s\r\n",local_20,pcVar3
           );
    nn_free((void *)0x14cd52);
  }
  strlen((char *)(in_RDI + 0x128c));
  nn_usock_send(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,iovcnt);
  return;
}

Assistant:

static void nn_ws_handshake_server_reply (struct nn_ws_handshake *self)
{
    struct nn_iovec response;
    char *code;
    char *version;
    char *protocol;
    int rc;

    /*  Allow room for NULL terminator. */
    char accept_key [NN_WS_HANDSHAKE_ACCEPT_KEY_LEN + 1];

    memset (self->response, 0, sizeof (self->response));

    if (self->response_code == NN_WS_HANDSHAKE_RESPONSE_OK) {
        /*  Upgrade connection as per RFC 6455 section 4.2.2. */
        
        rc = nn_ws_handshake_hash_key (self->key, self->key_len,
            accept_key, sizeof (accept_key));
        nn_assert (rc >= 0);

        nn_assert (strlen (accept_key) == NN_WS_HANDSHAKE_ACCEPT_KEY_LEN);

        protocol = nn_alloc (self->protocol_len + 1, "WebSocket protocol");
        alloc_assert (protocol);
        strncpy (protocol, self->protocol, self->protocol_len);
        protocol [self->protocol_len] = '\0';

        sprintf (self->response,
            "HTTP/1.1 101 Switching Protocols\r\n"
            "Upgrade: websocket\r\n"
            "Connection: Upgrade\r\n"
            "Sec-WebSocket-Accept: %s\r\n"
            "Sec-WebSocket-Protocol: %s\r\n\r\n",
            accept_key, protocol);

        nn_free (protocol);
    }
    else {
        /*  Fail the connection with a helpful hint. */
        switch (self->response_code) {
        case NN_WS_HANDSHAKE_RESPONSE_TOO_BIG:
            code = "400 Opening Handshake Too Long";
            break;
        case NN_WS_HANDSHAKE_RESPONSE_WSPROTO:
            code = "400 Cannot Have Body";
            break;
        case NN_WS_HANDSHAKE_RESPONSE_WSVERSION:
            code = "400 Unsupported WebSocket Version";
            break;
        case NN_WS_HANDSHAKE_RESPONSE_NNPROTO:
            code = "400 Missing nanomsg Required Headers";
            break;
        case NN_WS_HANDSHAKE_RESPONSE_NOTPEER:
            code = "400 Incompatible Socket Type";
            break;
        case NN_WS_HANDSHAKE_RESPONSE_UNKNOWNTYPE:
            code = "400 Unrecognized Socket Type";
            break;
        default:
            /*  Unexpected failure response. */
            nn_assert (0);
            break;
        }

        version = nn_alloc (self->version_len + 1, "WebSocket version");
        alloc_assert (version);
        strncpy (version, self->version, self->version_len);
        version [self->version_len] = '\0';

        /*  Fail connection as per RFC 6455 4.4. */
        sprintf (self->response,
            "HTTP/1.1 %s\r\n"
            "Sec-WebSocket-Version: %s\r\n",
            code, version);

        nn_free (version);
    }

    response.iov_len = strlen (self->response);
    response.iov_base = &self->response;

    nn_usock_send (self->usock, &response, 1);

    return;
}